

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Show.hpp
# Opt level: O1

void rc::
     showCollection<std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>
               (string *prefix,string *suffix,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *collection,ostream *os)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  pair = (collection->
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (collection->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pair != ppVar1) {
    detail::showValue<std::__cxx11::string,std::__cxx11::string>(pair,os);
    while (pair = pair + 1, pair != ppVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      detail::showValue<std::__cxx11::string,std::__cxx11::string>(pair,os);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(suffix->_M_dataplus)._M_p,suffix->_M_string_length);
  return;
}

Assistant:

void showCollection(const std::string &prefix,
                    const std::string &suffix,
                    const Collection &collection,
                    std::ostream &os) {
  os << prefix;
  auto cbegin = begin(collection);
  auto cend = end(collection);
  if (cbegin != cend) {
    show(*cbegin, os);
    for (auto it = ++cbegin; it != cend; it++) {
      os << ", ";
      show(*it, os);
    }
  }
  os << suffix;
}